

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int cmpfortree(void *av,void *bv)

{
  int bs;
  int as;
  NetSocket *b;
  NetSocket *a;
  void *bv_local;
  void *av_local;
  
  if (*(int *)((long)av + 8) < *(int *)((long)bv + 8)) {
    av_local._4_4_ = -1;
  }
  else if (*(int *)((long)bv + 8) < *(int *)((long)av + 8)) {
    av_local._4_4_ = 1;
  }
  else if (av < bv) {
    av_local._4_4_ = -1;
  }
  else if (bv < av) {
    av_local._4_4_ = 1;
  }
  else {
    av_local._4_4_ = 0;
  }
  return av_local._4_4_;
}

Assistant:

static int cmpfortree(void *av, void *bv)
{
    NetSocket *a = (NetSocket *) av, *b = (NetSocket *) bv;
    int as = a->s, bs = b->s;
    if (as < bs)
        return -1;
    if (as > bs)
        return +1;
    if (a < b)
       return -1;
    if (a > b)
       return +1;
    return 0;
}